

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void lowbd_inv_txfm2d_add_h_identity_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  undefined1 auVar1 [16];
  __m256i res_00;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  byte in_CL;
  long lVar7;
  byte in_R8B;
  int in_R9D;
  undefined1 auVar8 [32];
  __m256i res;
  int j_1;
  int step;
  int k;
  __m256i mshift;
  int32_t *input_cur;
  __m256i *buf0_cur;
  int j;
  __m256i buf0 [64];
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_avx2 col_txfm;
  int fun_idx_y;
  int rect_type;
  int buf_size_h_div16;
  int buf_size_w_div16;
  int input_stride;
  int txfm_size_row_notzero;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int eoby;
  int eobx;
  int in_stack_fffffffffffff628;
  int local_9cc;
  int local_9c4;
  undefined4 in_stack_fffffffffffff670;
  int iVar9;
  longlong lVar10;
  int local_944;
  longlong local_940 [39];
  int in_stack_fffffffffffff7f8;
  int in_stack_fffffffffffff7fc;
  int in_stack_fffffffffffff800;
  int in_stack_fffffffffffff804;
  int32_t *in_stack_fffffffffffff808;
  __m256i *in_stack_fffffffffffff810;
  __m256i *in_stack_fffffffffffff818;
  __m256i *in_stack_fffffffffffff820;
  int local_134;
  int local_130;
  int local_12c;
  transform_1d_avx2 local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int8_t *local_f8;
  int local_ec;
  int local_e8 [2];
  byte local_de;
  byte local_dd;
  ushort local_c2;
  undefined1 local_c0 [16];
  longlong lStack_b0;
  undefined8 uStack_a8;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  undefined1 local_80 [32];
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  
  local_de = in_R8B;
  local_dd = in_CL;
  get_eobx_eoby_scan_h_identity(local_e8,&local_ec,in_R8B,in_R9D);
  local_f8 = av1_inv_txfm_shift_ls[local_de];
  local_fc = get_txw_idx(local_de);
  local_100 = get_txh_idx(local_de);
  local_104 = tx_size_wide[local_de];
  local_108 = tx_size_high[local_de];
  local_9c4 = local_108;
  if (0x20 < local_108) {
    local_9c4 = 0x20;
  }
  local_10c = local_9c4;
  local_110 = local_9c4;
  local_114 = local_e8[0] + 0x10 >> 4;
  local_118 = local_ec + 0x10 >> 4;
  local_11c = get_rect_tx_log_ratio(local_104,local_108);
  local_120 = lowbd_txfm_all_1d_zeros_idx[local_ec];
  local_128 = lowbd_txfm_all_1d_zeros_w16_arr[local_100][""[local_dd]][local_120];
  get_flip_cfg(local_dd,&local_12c,&local_130);
  for (local_134 = 0; local_134 < local_114; local_134 = local_134 + 1) {
    for (local_944 = 0; local_944 < local_118; local_944 = local_944 + 1) {
      iidentity_row_16xn_avx2
                (in_stack_fffffffffffff810,in_stack_fffffffffffff808,in_stack_fffffffffffff804,
                 in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8,
                 in_stack_fffffffffffff628);
      transpose_16bit_16x16_avx2(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
    }
    (*local_128)((__m256i *)local_940,(__m256i *)local_940);
    uVar5 = 1 << (local_f8[1] + 0xfU & 0x1f);
    local_c2 = (ushort)uVar5;
    local_32 = local_c2;
    local_34 = local_c2;
    local_36 = local_c2;
    local_38 = local_c2;
    local_3a = local_c2;
    local_3c = local_c2;
    local_3e = local_c2;
    local_40 = local_c2;
    local_42 = local_c2;
    local_44 = local_c2;
    local_46 = local_c2;
    local_48 = local_c2;
    local_4a = local_c2;
    local_4c = local_c2;
    local_4e = local_c2;
    local_50 = local_c2;
    auVar1 = vpinsrw_avx(ZEXT216(local_c2),uVar5 & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,6);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,7);
    auVar8._0_16_ = vpinsrw_avx(ZEXT216(local_c2),uVar5 & 0xffff,1);
    auVar8._0_16_ = vpinsrw_avx(auVar8._0_16_,uVar5 & 0xffff,2);
    auVar8._0_16_ = vpinsrw_avx(auVar8._0_16_,uVar5 & 0xffff,3);
    auVar8._0_16_ = vpinsrw_avx(auVar8._0_16_,uVar5 & 0xffff,4);
    auVar8._0_16_ = vpinsrw_avx(auVar8._0_16_,uVar5 & 0xffff,5);
    auVar8._0_16_ = vpinsrw_avx(auVar8._0_16_,uVar5 & 0xffff,6);
    auVar8._0_16_ = vpinsrw_avx(auVar8._0_16_,uVar5 & 0xffff,7);
    auVar8._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar8._0_16_;
    auVar8._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    local_80 = auVar8;
    auVar8 = local_80;
    local_80._16_8_ = auVar8._16_8_;
    local_80._24_8_ = auVar8._24_8_;
    uVar4 = local_80._24_8_;
    if (local_12c == 0) {
      local_9cc = 0;
    }
    else {
      local_9cc = local_108 + -1;
    }
    iVar6 = 1;
    if (local_12c != 0) {
      iVar6 = -1;
    }
    iVar9 = 0;
    lVar10 = local_80._16_8_;
    local_80 = auVar8;
    while( true ) {
      if (local_108 <= iVar9) break;
      lVar7 = (long)local_9cc;
      local_a0 = local_940[lVar7 * 4];
      lStack_98 = local_940[lVar7 * 4 + 1];
      lStack_90 = local_940[lVar7 * 4 + 2];
      lStack_88 = local_940[lVar7 * 4 + 3];
      uStack_a8 = uVar4;
      auVar3._8_8_ = lStack_98;
      auVar3._0_8_ = local_a0;
      auVar3._16_8_ = lStack_90;
      auVar3._24_8_ = lStack_88;
      auVar2._16_8_ = lVar10;
      auVar2._0_16_ = auVar8._0_16_;
      auVar2._24_8_ = uVar4;
      vpmulhrsw_avx2(auVar3,auVar2);
      res_00[0]._4_4_ = local_9cc;
      res_00[0]._0_4_ = iVar6;
      res_00[1] = auVar8._0_8_;
      res_00[2] = auVar8._8_8_;
      res_00[3] = lVar10;
      lStack_b0 = lVar10;
      local_c0 = auVar8._0_16_;
      write_recon_w16_avx2(res_00,(uint8_t *)CONCAT44(iVar9,in_stack_fffffffffffff670));
      iVar9 = iVar9 + 1;
      local_9cc = iVar6 + local_9cc;
    }
  }
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_add_h_identity_avx2(
    const int32_t *input, uint8_t *output, int stride, TX_TYPE tx_type,
    TX_SIZE tx_size, int eob) {
  int eobx, eoby;
  get_eobx_eoby_scan_h_identity(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int txfm_size_row_notzero = AOMMIN(32, txfm_size_row);
  const int input_stride = txfm_size_row_notzero;
  const int buf_size_w_div16 = (eobx + 16) >> 4;
  const int buf_size_h_div16 = (eoby + 16) >> 4;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx_y = lowbd_txfm_all_1d_zeros_idx[eoby];
  const transform_1d_avx2 col_txfm =
      lowbd_txfm_all_1d_zeros_w16_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx_y];

  assert(col_txfm != NULL);

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_w_div16; i++) {
    __m256i buf0[64];
    for (int j = 0; j < buf_size_h_div16; j++) {
      __m256i *buf0_cur = buf0 + j * 16;
      const int32_t *input_cur = input + i * 16 * input_stride + j * 16;
      iidentity_row_16xn_avx2(buf0_cur, input_cur, input_stride, shift[0], 16,
                              txw_idx, rect_type);
      transpose_16bit_16x16_avx2(buf0_cur, buf0_cur);
    }
    col_txfm(buf0, buf0);
    __m256i mshift = _mm256_set1_epi16(1 << (15 + shift[1]));
    int k = ud_flip ? (txfm_size_row - 1) : 0;
    const int step = ud_flip ? -1 : 1;
    for (int j = 0; j < txfm_size_row; ++j, k += step) {
      __m256i res = _mm256_mulhrs_epi16(buf0[k], mshift);
      write_recon_w16_avx2(res, output + (i << 4) + j * stride);
    }
  }
}